

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O1

void png_set_crc_action(png_structrp png_ptr,int crit_action,int ancil_action)

{
  byte *pbVar1;
  uint uVar2;
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  switch(crit_action) {
  case 2:
    png_warning(png_ptr,"Can\'t discard critical data on CRC error");
  default:
    pbVar1 = (byte *)((long)&png_ptr->flags + 1);
    *pbVar1 = *pbVar1 & 0xf3;
    break;
  case 3:
    png_ptr->flags = png_ptr->flags & 0xfffff3ff | 0x400;
    break;
  case 4:
    pbVar1 = (byte *)((long)&png_ptr->flags + 1);
    *pbVar1 = *pbVar1 | 0xc;
    break;
  case 5:
    break;
  }
  switch(ancil_action) {
  case 1:
    uVar2 = png_ptr->flags & 0xfffffcff | 0x200;
    goto LAB_00113701;
  default:
    pbVar1 = (byte *)((long)&png_ptr->flags + 1);
    *pbVar1 = *pbVar1 & 0xfc;
    break;
  case 3:
    uVar2 = png_ptr->flags & 0xfffffcff | 0x100;
LAB_00113701:
    png_ptr->flags = uVar2;
    break;
  case 4:
    pbVar1 = (byte *)((long)&png_ptr->flags + 1);
    *pbVar1 = *pbVar1 | 3;
    break;
  case 5:
    break;
  }
  return;
}

Assistant:

void PNGAPI
png_set_crc_action(png_structrp png_ptr, int crit_action, int ancil_action)
{
   png_debug(1, "in png_set_crc_action");

   if (png_ptr == NULL)
      return;

   /* Tell libpng how we react to CRC errors in critical chunks */
   switch (crit_action)
   {
      case PNG_CRC_NO_CHANGE:                        /* Leave setting as is */
         break;

      case PNG_CRC_WARN_USE:                               /* Warn/use data */
         png_ptr->flags &= ~PNG_FLAG_CRC_CRITICAL_MASK;
         png_ptr->flags |= PNG_FLAG_CRC_CRITICAL_USE;
         break;

      case PNG_CRC_QUIET_USE:                             /* Quiet/use data */
         png_ptr->flags &= ~PNG_FLAG_CRC_CRITICAL_MASK;
         png_ptr->flags |= PNG_FLAG_CRC_CRITICAL_USE |
                           PNG_FLAG_CRC_CRITICAL_IGNORE;
         break;

      case PNG_CRC_WARN_DISCARD:    /* Not a valid action for critical data */
         png_warning(png_ptr,
             "Can't discard critical data on CRC error");
         /* FALLTHROUGH */
      case PNG_CRC_ERROR_QUIT:                                /* Error/quit */

      case PNG_CRC_DEFAULT:
      default:
         png_ptr->flags &= ~PNG_FLAG_CRC_CRITICAL_MASK;
         break;
   }

   /* Tell libpng how we react to CRC errors in ancillary chunks */
   switch (ancil_action)
   {
      case PNG_CRC_NO_CHANGE:                       /* Leave setting as is */
         break;

      case PNG_CRC_WARN_USE:                              /* Warn/use data */
         png_ptr->flags &= ~PNG_FLAG_CRC_ANCILLARY_MASK;
         png_ptr->flags |= PNG_FLAG_CRC_ANCILLARY_USE;
         break;

      case PNG_CRC_QUIET_USE:                            /* Quiet/use data */
         png_ptr->flags &= ~PNG_FLAG_CRC_ANCILLARY_MASK;
         png_ptr->flags |= PNG_FLAG_CRC_ANCILLARY_USE |
                           PNG_FLAG_CRC_ANCILLARY_NOWARN;
         break;

      case PNG_CRC_ERROR_QUIT:                               /* Error/quit */
         png_ptr->flags &= ~PNG_FLAG_CRC_ANCILLARY_MASK;
         png_ptr->flags |= PNG_FLAG_CRC_ANCILLARY_NOWARN;
         break;

      case PNG_CRC_WARN_DISCARD:                      /* Warn/discard data */

      case PNG_CRC_DEFAULT:
      default:
         png_ptr->flags &= ~PNG_FLAG_CRC_ANCILLARY_MASK;
         break;
   }
}